

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Model::ResolveLinks(Model *this,Element *element,Document *doc)

{
  pointer *pppMVar1;
  pointer *pppGVar2;
  pointer *pppNVar3;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  vector<Assimp::FBX::NodeAttribute_const*,std::allocator<Assimp::FBX::NodeAttribute_const*>>
  *pvVar4;
  vector<Assimp::FBX::NodeAttribute_const*,std::allocator<Assimp::FBX::NodeAttribute_const*>>
  *pvVar5;
  Object *pOVar6;
  pointer ppCVar7;
  NodeAttribute *att;
  Geometry *geo;
  Material *mat;
  char *arr [3];
  string local_b8;
  Element *local_98;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_90
  ;
  vector<Assimp::FBX::NodeAttribute_const*,std::allocator<Assimp::FBX::NodeAttribute_const*>>
  *local_78;
  vector<Assimp::FBX::Geometry_const*,std::allocator<Assimp::FBX::Geometry_const*>> *local_70;
  vector<Assimp::FBX::Material_const*,std::allocator<Assimp::FBX::Material_const*>> *local_68;
  NodeAttribute *local_60;
  Geometry *local_58;
  Material *local_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  local_38 = "NodeAttribute";
  local_48 = "Geometry";
  pcStack_40 = "Material";
  local_98 = element;
  Document::GetConnectionsByDestinationSequenced(&local_90,doc,(this->super_Object).id,&local_48,3);
  local_68 = (vector<Assimp::FBX::Material_const*,std::allocator<Assimp::FBX::Material_const*>> *)
             &this->materials;
  std::vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>::
  reserve((vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_> *)
          local_68,(long)local_90.
                         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_90.
                         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_70 = (vector<Assimp::FBX::Geometry_const*,std::allocator<Assimp::FBX::Geometry_const*>> *)
             &this->geometry;
  std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::
  reserve((vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_> *)
          local_70,(long)local_90.
                         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_90.
                         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>::
  reserve(&this->attributes,
          (long)local_90.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_90.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  pvVar5 = (vector<Assimp::FBX::NodeAttribute_const*,std::allocator<Assimp::FBX::NodeAttribute_const*>>
            *)&this->attributes;
  ppCVar7 = local_90.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = local_78;
  do {
    local_78 = pvVar5;
    if (ppCVar7 ==
        local_90.
        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_90.
          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        local_78 = pvVar4;
        operator_delete(local_90.
                        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    if (((*ppCVar7)->prop)._M_string_length == 0) {
      pOVar6 = Connection::SourceObject(*ppCVar7);
      if (pOVar6 == (Object *)0x0) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,
                   "failed to read source object for incoming Model link, ignoring","");
        Util::DOMWarning(&local_b8,local_98);
LAB_005e3225:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
      else {
        local_50 = (Material *)__dynamic_cast(pOVar6,&Object::typeinfo,&FBX::Material::typeinfo,0);
        if (local_50 == (Material *)0x0) {
          local_58 = (Geometry *)__dynamic_cast(pOVar6,&Object::typeinfo,&Geometry::typeinfo,0);
          if (local_58 == (Geometry *)0x0) {
            local_60 = (NodeAttribute *)
                       __dynamic_cast(pOVar6,&Object::typeinfo,&NodeAttribute::typeinfo,0);
            if (local_60 == (NodeAttribute *)0x0) {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,
                         "source object for model link is neither Material, NodeAttribute nor Geometry, ignoring"
                         ,"");
              Util::DOMWarning(&local_b8,local_98);
              goto LAB_005e3225;
            }
            __position_01._M_current =
                 (this->attributes).
                 super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position_01._M_current ==
                (this->attributes).
                super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<Assimp::FBX::NodeAttribute_const*,std::allocator<Assimp::FBX::NodeAttribute_const*>>
              ::_M_realloc_insert<Assimp::FBX::NodeAttribute_const*const&>
                        (local_78,__position_01,&local_60);
            }
            else {
              *__position_01._M_current = local_60;
              pppNVar3 = &(this->attributes).
                          super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppNVar3 = *pppNVar3 + 1;
            }
          }
          else {
            __position_00._M_current =
                 (this->geometry).
                 super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (this->geometry).
                super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Assimp::FBX::Geometry_const*,std::allocator<Assimp::FBX::Geometry_const*>>
              ::_M_realloc_insert<Assimp::FBX::Geometry_const*const&>
                        (local_70,__position_00,&local_58);
            }
            else {
              *__position_00._M_current = local_58;
              pppGVar2 = &(this->geometry).
                          super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppGVar2 = *pppGVar2 + 1;
            }
          }
        }
        else {
          __position._M_current =
               (this->materials).
               super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->materials).
              super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::FBX::Material_const*,std::allocator<Assimp::FBX::Material_const*>>::
            _M_realloc_insert<Assimp::FBX::Material_const*const&>(local_68,__position,&local_50);
          }
          else {
            *__position._M_current = local_50;
            pppMVar1 = &(this->materials).
                        super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppMVar1 = *pppMVar1 + 1;
          }
        }
      }
    }
    ppCVar7 = ppCVar7 + 1;
    pvVar5 = local_78;
    pvVar4 = local_78;
  } while( true );
}

Assistant:

void Model::ResolveLinks(const Element& element, const Document& doc)
{
    const char* const arr[] = {"Geometry","Material","NodeAttribute"};

    // resolve material
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),arr, 3);

    materials.reserve(conns.size());
    geometry.reserve(conns.size());
    attributes.reserve(conns.size());
    for(const Connection* con : conns) {

        // material and geometry links should be Object-Object connections
        if (con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for incoming Model link, ignoring",&element);
            continue;
        }

        const Material* const mat = dynamic_cast<const Material*>(ob);
        if(mat) {
            materials.push_back(mat);
            continue;
        }

        const Geometry* const geo = dynamic_cast<const Geometry*>(ob);
        if(geo) {
            geometry.push_back(geo);
            continue;
        }

        const NodeAttribute* const att = dynamic_cast<const NodeAttribute*>(ob);
        if(att) {
            attributes.push_back(att);
            continue;
        }

        DOMWarning("source object for model link is neither Material, NodeAttribute nor Geometry, ignoring",&element);
        continue;
    }
}